

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void memory_map_init(uc_struct_conflict15 *uc)

{
  MemoryRegion *pMVar1;
  uc_struct_conflict15 *uc_local;
  
  pMVar1 = (MemoryRegion *)g_malloc(0xa0);
  uc->system_memory = pMVar1;
  memory_region_init_tricore(uc,(MemoryRegion_conflict *)uc->system_memory,0xffffffffffffffff);
  address_space_init_tricore
            (uc,&uc->address_space_memory,(MemoryRegion_conflict *)uc->system_memory);
  pMVar1 = (MemoryRegion *)g_malloc(0xa0);
  uc->system_io = pMVar1;
  memory_region_init_io_tricore
            (uc,(MemoryRegion_conflict *)uc->system_io,&unassigned_io_ops,(void *)0x0,0x10000);
  address_space_init_tricore(uc,&uc->address_space_io,(MemoryRegion_conflict *)uc->system_io);
  return;
}

Assistant:

static void memory_map_init(struct uc_struct *uc)
{
    uc->system_memory = g_malloc(sizeof(*(uc->system_memory)));
    memory_region_init(uc, uc->system_memory, UINT64_MAX);
    address_space_init(uc, &uc->address_space_memory, uc->system_memory);

    uc->system_io = g_malloc(sizeof(*(uc->system_io)));
    memory_region_init_io(uc, uc->system_io, &unassigned_io_ops, NULL, 65536);
    address_space_init(uc, &uc->address_space_io, uc->system_io);
}